

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::PushStyleColor(ImPlotCol idx,ImVec4 *col)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImPlotContext *pIVar8;
  ImGuiColorMod *__dest;
  int iVar9;
  ImVec4 *pIVar10;
  int iVar11;
  
  pIVar8 = GImPlot;
  pIVar10 = (GImPlot->Style).Colors + idx;
  fVar4 = pIVar10->x;
  fVar5 = pIVar10->y;
  pIVar1 = (GImPlot->Style).Colors + idx;
  fVar6 = pIVar1->z;
  fVar7 = pIVar1->w;
  iVar11 = (GImPlot->ColorModifiers).Size;
  iVar2 = (GImPlot->ColorModifiers).Capacity;
  if (iVar11 == iVar2) {
    iVar11 = iVar11 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar2 < iVar11) {
      __dest = (ImGuiColorMod *)ImGui::MemAlloc((long)iVar11 * 0x14);
      pIVar3 = (pIVar8->ColorModifiers).Data;
      if (pIVar3 != (ImGuiColorMod *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar8->ColorModifiers).Size * 0x14);
        ImGui::MemFree((pIVar8->ColorModifiers).Data);
      }
      (pIVar8->ColorModifiers).Data = __dest;
      (pIVar8->ColorModifiers).Capacity = iVar11;
    }
  }
  pIVar3 = (pIVar8->ColorModifiers).Data;
  iVar11 = (pIVar8->ColorModifiers).Size;
  pIVar3[iVar11].Col = idx;
  pIVar1 = &pIVar3[iVar11].BackupValue;
  pIVar1->x = fVar4;
  pIVar1->y = fVar5;
  pIVar1->z = fVar6;
  pIVar1->w = fVar7;
  (pIVar8->ColorModifiers).Size = (pIVar8->ColorModifiers).Size + 1;
  fVar4 = col->y;
  fVar5 = col->z;
  fVar6 = col->w;
  pIVar10->x = col->x;
  pIVar10->y = fVar4;
  pIVar1 = (pIVar8->Style).Colors + idx;
  pIVar1->z = fVar5;
  pIVar1->w = fVar6;
  return;
}

Assistant:

void PushStyleColor(ImPlotCol idx, const ImVec4& col) {
    ImPlotContext& gp = *GImPlot;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = gp.Style.Colors[idx];
    gp.ColorModifiers.push_back(backup);
    gp.Style.Colors[idx] = col;
}